

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

aiScene * __thiscall
Assimp::Importer::ApplyCustomizedPostProcessing
          (Importer *this,BaseProcess *rootProcess,bool requestValidation)

{
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> this_00;
  Logger *pLVar1;
  int *piVar2;
  Profiler *this_01;
  _Rb_tree_header *p_Var3;
  aiScene *paVar4;
  ValidateDSProcess ds;
  unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
  profiler;
  string local_50;
  _Head_base<0UL,_Assimp::Profiling::Profiler_*,_false> local_30;
  
  paVar4 = this->pimpl->mScene;
  if (paVar4 == (aiScene *)0x0) {
LAB_00348b8b:
    paVar4 = (aiScene *)0x0;
  }
  else {
    if (rootProcess == (BaseProcess *)0x0) {
      return paVar4;
    }
    pLVar1 = DefaultLogger::get();
    Logger::info(pLVar1,"Entering customized post processing pipeline");
    if (requestValidation) {
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_50);
      BaseProcess::ExecuteOnScene((BaseProcess *)&local_50,this);
      paVar4 = this->pimpl->mScene;
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_50);
      if (paVar4 == (aiScene *)0x0) goto LAB_00348b8b;
    }
    local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
    piVar2 = GetGenericProperty<int>
                       (&this->pimpl->mIntProperties,"GLOB_MEASURE_TIME",(int *)&local_50);
    if (*piVar2 == 0) {
      this_01 = (Profiler *)0x0;
    }
    else {
      this_01 = (Profiler *)operator_new(0x30);
      p_Var3 = &(this_01->regions)._M_t._M_impl.super__Rb_tree_header;
      (this_01->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (this_01->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this_01->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      (this_01->regions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      (this_01->regions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    }
    local_30._M_head_impl = this_01;
    if (this_01 != (Profiler *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"postprocess","");
      Profiling::Profiler::BeginRegion(this_01,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    BaseProcess::ExecuteOnScene(rootProcess,this);
    this_00._M_head_impl = local_30._M_head_impl;
    if (local_30._M_head_impl != (Profiler *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"postprocess","");
      Profiling::Profiler::EndRegion(this_00._M_head_impl,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if ((requestValidation | this->pimpl->bExtraVerbose) == 1) {
      pLVar1 = DefaultLogger::get();
      Logger::debug(pLVar1,"Verbose Import: revalidating data structures");
      ValidateDSProcess::ValidateDSProcess((ValidateDSProcess *)&local_50);
      BaseProcess::ExecuteOnScene((BaseProcess *)&local_50,this);
      if (this->pimpl->mScene == (aiScene *)0x0) {
        pLVar1 = DefaultLogger::get();
        Logger::error(pLVar1,"Verbose Import: failed to revalidate data structures");
      }
      ValidateDSProcess::~ValidateDSProcess((ValidateDSProcess *)&local_50);
    }
    SharedPostProcessInfo::Clean(this->pimpl->mPPShared);
    pLVar1 = DefaultLogger::get();
    Logger::info(pLVar1,"Leaving customized post processing pipeline");
    std::unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
    ::~unique_ptr((unique_ptr<Assimp::Profiling::Profiler,_std::default_delete<Assimp::Profiling::Profiler>_>
                   *)&local_30);
    paVar4 = this->pimpl->mScene;
  }
  return paVar4;
}

Assistant:

const aiScene* Importer::ApplyCustomizedPostProcessing( BaseProcess *rootProcess, bool requestValidation ) {
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // Return immediately if no scene is active
    if ( NULL == pimpl->mScene ) {
        return NULL;
    }

    // If no flags are given, return the current scene with no further action
    if ( NULL == rootProcess ) {
        return pimpl->mScene;
    }

    // In debug builds: run basic flag validation
    ASSIMP_LOG_INFO( "Entering customized post processing pipeline" );

#ifndef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
    // The ValidateDS process plays an exceptional role. It isn't contained in the global
    // list of post-processing steps, so we need to call it manually.
    if ( requestValidation )
    {
        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            return NULL;
        }
    }
#endif // no validation
#ifdef ASSIMP_BUILD_DEBUG
    if ( pimpl->bExtraVerbose )
    {
#ifdef ASSIMP_BUILD_NO_VALIDATEDS_PROCESS
        ASSIMP_LOG_ERROR( "Verbose Import is not available due to build settings" );
#endif  // no validation
    }
#else
    if ( pimpl->bExtraVerbose ) {
        ASSIMP_LOG_WARN( "Not a debug build, ignoring extra verbose setting" );
    }
#endif // ! DEBUG

    std::unique_ptr<Profiler> profiler( GetPropertyInteger( AI_CONFIG_GLOB_MEASURE_TIME, 0 ) ? new Profiler() : NULL );

    if ( profiler ) {
        profiler->BeginRegion( "postprocess" );
    }

    rootProcess->ExecuteOnScene( this );

    if ( profiler ) {
        profiler->EndRegion( "postprocess" );
    }

    // If the extra verbose mode is active, execute the ValidateDataStructureStep again - after each step
    if ( pimpl->bExtraVerbose || requestValidation  ) {
        ASSIMP_LOG_DEBUG( "Verbose Import: revalidating data structures" );

        ValidateDSProcess ds;
        ds.ExecuteOnScene( this );
        if ( !pimpl->mScene ) {
            ASSIMP_LOG_ERROR( "Verbose Import: failed to revalidate data structures" );
        }
    }

    // clear any data allocated by post-process steps
    pimpl->mPPShared->Clean();
    ASSIMP_LOG_INFO( "Leaving customized post processing pipeline" );

    ASSIMP_END_EXCEPTION_REGION( const aiScene* );

    return pimpl->mScene;
}